

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_binary.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  GLuint GVar2;
  GLuint GVar3;
  GLenum GVar4;
  char *pcVar5;
  GLint *pGVar6;
  void *pvVar7;
  FILE *pFVar8;
  size_t __size;
  ulong uVar9;
  bool bVar10;
  GLenum binaryFormat;
  GLint status;
  GLsizei length;
  GLint binaryLength;
  GLenum local_430;
  GLint local_42c;
  uint local_428;
  GLuint local_424;
  char *local_420;
  int local_418 [250];
  
  pcVar5 = getenv("DRY_RUN");
  glfwInit();
  glfwWindowHint(0x20004,0);
  glfwWindowHint(0x22002,3);
  glfwWindowHint(0x22003,2);
  glfwWindowHint(0x22006,1);
  glfwWindowHint(0x22008,0x32001);
  glfwWindowHint(0x22007,1);
  window = glfwCreateWindow(0xfa,0xfa,*argv,(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (window == (GLFWwindow *)0x0) {
    return 0x7d;
  }
  glfwMakeContextCurrent(window);
  iVar1 = gladLoadGLLoader(glfwGetProcAddress);
  if (iVar1 == 0) {
    return 1;
  }
  if (GLAD_GL_KHR_debug != 0) {
    (*glad_glDebugMessageCallback)(debugMessageCallback,(void *)0x0);
  }
  if (GLAD_GL_ARB_get_program_binary == 0 && GLAD_GL_VERSION_4_1 == 0) {
    exit(0x7d);
  }
  local_428 = 0;
  local_420 = pcVar5;
  (*glad_glGetIntegerv)(0x87fe,(GLint *)&local_428);
  uVar9 = (ulong)local_428;
  if ((pcVar5 == (char *)0x0 && local_428 != 0) || ((int)local_428 < 0)) {
    main_cold_8();
LAB_001082e4:
    main_cold_1();
LAB_001082e9:
    main_cold_7();
LAB_001082fa:
    main_cold_6();
LAB_0010830c:
    main_cold_5();
LAB_0010831b:
    main_cold_3();
  }
  else {
    pGVar6 = (GLint *)operator_new__(uVar9 * 4 + 4);
    pGVar6[uVar9] = 0xbadf00d;
    (*glad_glGetIntegerv)(0x87ff,pGVar6);
    if (pGVar6[(int)local_428] != 0xbadf00d) goto LAB_001082e4;
    (*glad_glClearColor)(0.3,0.1,0.3,1.0);
    GVar2 = (*glad_glCreateShader)(0x8b30);
    (*glad_glShaderSource)(GVar2,1,&init()::fragShaderText,(GLint *)0x0);
    (*glad_glCompileShader)(GVar2);
    (*glad_glGetShaderiv)(GVar2,0x8b81,(GLint *)&local_430);
    if (local_430 == 0) goto LAB_001082e9;
    GVar3 = (*glad_glCreateShader)(0x8b31);
    (*glad_glShaderSource)(GVar3,1,&init()::vertShaderText,(GLint *)0x0);
    (*glad_glCompileShader)(GVar3);
    (*glad_glGetShaderiv)(GVar3,0x8b81,(GLint *)&local_430);
    if (local_430 == 0) goto LAB_001082fa;
    program = (*glad_glCreateProgram)();
    local_424 = GVar2;
    (*glad_glAttachShader)(program,GVar2);
    (*glad_glAttachShader)(program,GVar3);
    (*glad_glBindAttribLocation)(program,0,"pos");
    (*glad_glBindAttribLocation)(program,1,"color");
    (*glad_glProgramParameteri)(program,0x8257,1);
    (*glad_glLinkProgram)(program);
    (*glad_glGetProgramiv)(program,0x8b82,(GLint *)&local_430);
    pcVar5 = local_420;
    if (local_430 == 0) goto LAB_0010830c;
    bVar10 = local_420 != (char *)0x0;
    glfwGetFramebufferSize(window,local_418,(int *)&local_428);
    (*glad_glViewport)(0,0,local_418[0],local_428);
    draw();
    local_418[0] = 0;
    (*glad_glGetProgramiv)(program,0x8741,local_418);
    GVar2 = local_424;
    if ((bVar10 || local_418[0] == 0) && (-1 < local_418[0])) {
      do {
        GVar4 = (*glad_glGetError)();
      } while (GVar4 != 0);
      iVar1 = 0x2000000;
      if (0 < local_418[0]) {
        iVar1 = local_418[0];
      }
      pvVar7 = malloc((long)iVar1);
      local_428 = 0;
      local_430 = 0;
      (*glad_glGetProgramBinary)(program,iVar1,(GLsizei *)&local_428,&local_430,pvVar7);
      GVar4 = (*glad_glGetError)();
      if ((pcVar5 != (char *)0x0) || (GVar4 != 0)) {
        if (pcVar5 != (char *)0x0) {
          pFVar8 = fopen("program_binary.bin","wb");
          fwrite(&local_430,4,1,pFVar8);
          fwrite(local_418,4,1,pFVar8);
          fwrite(pvVar7,1,(long)local_418[0],pFVar8);
          fclose(pFVar8);
        }
        free(pvVar7);
        (*glad_glDeleteShader)(GVar2);
        (*glad_glDeleteShader)(GVar3);
        (*glad_glDeleteProgram)(program);
        program = (*glad_glCreateProgram)();
        pFVar8 = fopen("program_binary.bin","rb");
        fread(&local_430,4,1,pFVar8);
        fread(local_418,4,1,pFVar8);
        __size = (size_t)local_418[0];
        pvVar7 = malloc(__size);
        fread(pvVar7,1,__size,pFVar8);
        fclose(pFVar8);
        (*glad_glProgramBinary)(program,local_430,pvVar7,local_418[0]);
        local_42c = 0;
        (*glad_glGetProgramiv)(program,0x8b82,&local_42c);
        if (local_42c == 0) {
          main_cold_2();
        }
        if (local_42c == 0 || local_420 != (char *)0x0) {
          if (local_42c != 0) {
            draw();
          }
          glfwDestroyWindow(window);
          glfwTerminate();
          return 0;
        }
        goto LAB_0010832a;
      }
      goto LAB_0010831b;
    }
  }
  main_cold_4();
LAB_0010832a:
  exit(1);
}

Assistant:

int
main(int argc, char *argv[])
{
    tracing = !getenv("DRY_RUN");

    glfwInit();

    glfwWindowHint(GLFW_VISIBLE, GL_FALSE);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 3);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 2);
    glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE);
    glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
    glfwWindowHint(GLFW_OPENGL_DEBUG_CONTEXT, GL_TRUE);

    window = glfwCreateWindow(250, 250, argv[0], NULL, NULL);
    if (!window) {
         return EXIT_SKIP;
    }

    glfwMakeContextCurrent(window);

    if (!gladLoadGLLoader((GLADloadproc) glfwGetProcAddress)) {
       return EXIT_FAILURE;
    }

    if (GLAD_GL_KHR_debug) {
        glDebugMessageCallback(&debugMessageCallback, NULL);
    }

    init();
    reshape();
    draw();

    GLint binaryLength = 0;
    glGetProgramiv(program, GL_PROGRAM_BINARY_LENGTH, &binaryLength);
    if ((tracing && binaryLength != 0) ||
        binaryLength < 0) {
        fprintf(stderr, "error: glGetProgramiv(GL_PROGRAM_BINARY_LENGTH) = %i\n", binaryLength);
        exit(EXIT_FAILURE);
    }

    while (glGetError() != GL_NO_ERROR) ;

    GLsizei bufSize = binaryLength > 0 ? binaryLength : 32 * 1024 * 1024;
    void *binary = malloc(bufSize);
    GLsizei length = 0;
    GLenum binaryFormat = GL_NONE;
    glGetProgramBinary(program, bufSize, &length, &binaryFormat, binary);
    GLenum error = glGetError();
    if (tracing && error == GL_NO_ERROR) {
        fprintf(stderr, "error: glGetProgramiv(GL_PROGRAM_BINARY_LENGTH) = %i\n", binaryLength);
        exit(EXIT_FAILURE);
    }

    FILE *fp;

    if (!tracing) {
        fp = fopen("program_binary.bin", "wb");
        fwrite(&binaryFormat, sizeof binaryFormat, 1, fp);
        fwrite(&binaryLength, sizeof binaryLength, 1, fp);
        fwrite(binary, 1, binaryLength, fp);
        fclose(fp);
    }

    free(binary);
   
    glDeleteShader(fragShader);
    glDeleteShader(vertShader);
    glDeleteProgram(program);

    program = glCreateProgram();

    fp = fopen("program_binary.bin", "rb");
    fread(&binaryFormat, sizeof binaryFormat, 1, fp);
    fread(&binaryLength, sizeof binaryLength, 1, fp);
    binary = malloc(binaryLength);
    fread(binary, 1, binaryLength, fp);
    fclose(fp);

    glProgramBinary(program, binaryFormat, binary, binaryLength);
    
    GLint status = 0;
    glGetProgramiv(program, GL_LINK_STATUS, &status);
    if (!status) {
        GLsizei len;
        char log[1000];
        glGetProgramInfoLog(program, sizeof log, &len, log);
        fprintf(stderr, "warning: glProgramBinary failed -- %s\n", log);
    }
    if (tracing && status) {
        exit(EXIT_FAILURE);
    }

    if (status) {
        draw();
    }

    glfwDestroyWindow(window);
    glfwTerminate();

    return 0;
}